

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCompare(Expr *pA,Expr *pB,int iTab)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char *__s1;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if (pA == (Expr *)0x0 || pB == (Expr *)0x0) {
    return (uint)(pB != pA) * 2;
  }
  uVar5 = pA->flags;
  uVar3 = pB->flags;
  uVar6 = uVar3 | uVar5;
  if ((uVar6 >> 10 & 1) == 0) {
    bVar1 = pA->op;
    bVar2 = pB->op;
    if (bVar1 == bVar2) {
      if (((bVar1 | 2) != 0x9a) && (__s1 = (pA->u).zToken, __s1 != (char *)0x0)) {
        if (bVar1 == 0x97) {
          iVar4 = sqlite3StrICmp(__s1,(pB->u).zToken);
          if (iVar4 != 0) {
            return 2;
          }
        }
        else {
          iVar4 = strcmp(__s1,(pB->u).zToken);
          if (iVar4 != 0) {
            return (bVar1 != 0x35) + 1;
          }
        }
      }
      if (((uVar3 ^ uVar5) & 0x10) != 0) {
        return 2;
      }
      if ((uVar6 >> 0xe & 1) == 0) {
        if ((uVar6 >> 0xb & 1) != 0) {
          return 2;
        }
        iVar4 = sqlite3ExprCompare(pA->pLeft,pB->pLeft,iTab);
        if (iVar4 != 0) {
          return 2;
        }
        iVar4 = sqlite3ExprCompare(pA->pRight,pB->pRight,iTab);
        if (iVar4 != 0) {
          return 2;
        }
        iVar4 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
        if (iVar4 != 0) {
          return 2;
        }
        if (bVar1 != 0x61 && (uVar6 >> 0xd & 1) == 0) {
          if (pA->iColumn != pB->iColumn) {
            return 2;
          }
          if ((pA->iTable != pB->iTable) && (-1 < pB->iTable || pA->iTable != iTab)) {
            return 2;
          }
        }
      }
      return 0;
    }
    if ((bVar1 == 0x35) && (uVar5 = sqlite3ExprCompare(pA->pLeft,pB,iTab), uVar5 < 2)) {
      return 1;
    }
    if ((bVar2 == 0x35) && (uVar5 = sqlite3ExprCompare(pA,pB->pLeft,iTab), uVar5 < 2)) {
      return 1;
    }
  }
  else if ((((uVar5 & uVar3) >> 10 & 1) != 0) && ((pA->u).iValue == (pB->u).iValue)) {
    return 0;
  }
  return 2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(Expr *pA, Expr *pB, int iTab){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pA->pLeft, pB, iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pA, pB->pLeft, iTab)<2 ){
      return 1;
    }
    return 2;
  }
  if( pA->op!=TK_COLUMN && pA->op!=TK_AGG_COLUMN && pA->u.zToken ){
    if( pA->op==TK_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else if( strcmp(pA->u.zToken,pB->u.zToken)!=0 ){
      return pA->op==TK_COLLATE ? 1 : 2;
    }
  }
  if( (pA->flags & EP_Distinct)!=(pB->flags & EP_Distinct) ) return 2;
  if( ALWAYS((combinedFlags & EP_TokenOnly)==0) ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( sqlite3ExprCompare(pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( ALWAYS((combinedFlags & EP_Reduced)==0) && pA->op!=TK_STRING ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->iTable!=pB->iTable 
       && (pA->iTable!=iTab || NEVER(pB->iTable>=0)) ) return 2;
    }
  }
  return 0;
}